

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCall.cpp
# Opt level: O2

MockExpectedCall * __thiscall
MockCheckedExpectedCall::withBoolParameter
          (MockCheckedExpectedCall *this,SimpleString *name,bool value)

{
  MockExpectedFunctionParameter *this_00;
  
  this_00 = (MockExpectedFunctionParameter *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockExpectedCall.cpp"
                         ,0x5a);
  MockExpectedFunctionParameter::MockExpectedFunctionParameter(this_00,name);
  MockNamedValueList::add(this->inputParameters_,(MockNamedValue *)this_00);
  (*(this_00->super_MockNamedValue)._vptr_MockNamedValue[2])(this_00,(ulong)value);
  return &this->super_MockExpectedCall;
}

Assistant:

MockExpectedCall& MockCheckedExpectedCall::withBoolParameter(const SimpleString& name, bool value)
{
    MockNamedValue* newParameter = new MockExpectedFunctionParameter(name);
    inputParameters_->add(newParameter);
    newParameter->setValue(value);
    return *this;
}